

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O2

void celero::executor::Run(shared_ptr<celero::Benchmark> *bmark)

{
  bool bVar1;
  __shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  std::__shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,&bmark->super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>);
  bVar1 = RunBaseline((shared_ptr<celero::Benchmark> *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  if (bVar1) {
    std::__shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,&bmark->super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>);
    RunExperiments((shared_ptr<celero::Benchmark> *)&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  }
  return;
}

Assistant:

void executor::Run(std::shared_ptr<Benchmark> bmark)
{
	if(executor::RunBaseline(bmark) == true)
	{
		executor::RunExperiments(bmark);
	}
}